

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_AmrLevel.cpp
# Opt level: O3

void __thiscall
amrex::FillPatchIteratorHelper::Initialize
          (FillPatchIteratorHelper *this,int boxGrow,Real time,int idx,int scomp,int ncomp,
          InterpBase *mapper)

{
  undefined1 *__args;
  _Rb_tree_header *p_Var1;
  StateData *this_00;
  undefined8 *puVar2;
  undefined8 *puVar3;
  char cVar4;
  IndexType _btype;
  int iVar5;
  AmrLevel *pAVar6;
  __uniq_ptr_data<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>,_true,_true> _Var7;
  element_type *peVar8;
  __uniq_ptr_data<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>,_true,_true> _Var9;
  pointer pBVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  _Base_ptr p_Var13;
  undefined8 uVar14;
  void *pvVar15;
  Vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
  *pVVar16;
  bool extrap;
  bool bVar17;
  int dir;
  Interpolater *pIVar18;
  StateDescriptor *this_01;
  iterator iVar19;
  iterator iVar20;
  pointer pIVar21;
  Box *this_02;
  mapped_type *pmVar22;
  mapped_type *pmVar23;
  mapped_type *pmVar24;
  _Rb_tree_node_base *p_Var25;
  byte bVar26;
  long lVar27;
  Box *pBVar28;
  Box *pBVar29;
  long lVar30;
  ulong uVar31;
  pointer pBVar32;
  vector<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>,_std::allocator<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>_>_>
  *this_03;
  pointer pIVar33;
  IntVect *iv;
  vector<amrex::Box,_std::allocator<amrex::Box>_> *pvVar34;
  int iVar35;
  ulong uVar36;
  uint uVar37;
  Box *fbx;
  long lVar38;
  pointer pBVar39;
  int iVar40;
  int iVar41;
  Box r;
  Vector<amrex::Box,_std::allocator<amrex::Box>_> crse_boxes;
  Vector<amrex::Box,_std::allocator<amrex::Box>_> unfilledThisLevel;
  BoxList bl;
  Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> pshifts;
  BoxList unfillableThisLevel;
  int bxidx;
  Vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
  *local_90;
  Interpolater **local_88;
  BoxList tempUnfillable;
  
  if (mapper == (InterpBase *)0x0) {
    this->m_map = (Interpolater *)0x0;
LAB_005b7bfb:
    local_88 = &this->m_map;
    Assert_host("m_map",
                "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/amrex/Src/Amr/AMReX_AmrLevel.cpp"
                ,0x2ec,"\"Cannot use MFInterpolater without proper nesting\"");
  }
  else {
    pIVar18 = (Interpolater *)__dynamic_cast(mapper,&InterpBase::typeinfo,&Interpolater::typeinfo,0)
    ;
    local_88 = &this->m_map;
    this->m_map = pIVar18;
    if (pIVar18 == (Interpolater *)0x0) goto LAB_005b7bfb;
  }
  this->m_time = time;
  this->m_growsize = boxGrow;
  this->m_index = idx;
  this->m_scomp = scomp;
  this->m_ncomp = ncomp;
  pAVar6 = this->m_amrlevel;
  cVar4 = (pAVar6->geom).super_CoordSys.field_0x52;
  if ((pAVar6->geom).super_CoordSys.field_0x51 == '\0') {
    bVar26 = true;
    if (cVar4 == '\0') {
      bVar26 = (pAVar6->geom).super_CoordSys.field_0x53;
    }
  }
  else {
    bVar26 = true;
    if (cVar4 != '\0') {
      bVar26 = (pAVar6->geom).super_CoordSys.field_0x53 ^ 1;
    }
  }
  this->m_FixUpCorners = (bool)bVar26;
  iVar40 = *(int *)(ParallelContext::frames + 0xc);
  local_90 = Amr::getAmrLevels(pAVar6->parent);
  _Var7.super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>._M_t.
  super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>.
  super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl =
       (local_90->
       super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
       ).
       super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start[this->m_amrlevel->level]._M_t.
       super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>;
  iVar41 = this->m_index;
  lVar27 = 0xc;
  _btype.itype = 0;
  switch((this->m_leveldata->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.boxarray.m_bat.
         m_bat_type) {
  case null:
  case coarsenRatio:
    break;
  default:
    lVar27 = 0x10;
  case indexType:
  case indexType_coarsenRatio:
    _btype.itype = *(uint *)((long)&(this->m_leveldata->super_FabArray<amrex::FArrayBox>).
                                    super_FabArrayBase._vptr_FabArrayBase + lVar27);
  }
  lVar27 = *(long *)((long)_Var7.
                           super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                           .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl + 0x170);
  this_01 = DescriptorList::operator[]((DescriptorList *)AmrLevel::desc_lst,iVar41);
  extrap = StateDescriptor::extrap(this_01);
  pVVar16 = local_90;
  if (-1 < this->m_amrlevel->level) {
    lVar30 = -1;
    lVar38 = 0;
    do {
      StateData::RegisterData
                ((StateData *)
                 ((long)this->m_index * 0xe0 +
                 *(long *)((long)(pVVar16->
                                 super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                                 ).
                                 super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[lVar30 + 1]._M_t.
                                 super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                          + 0x170)),&this->m_mfcd,
                 (Vector<amrex::FabArrayId,_std::allocator<amrex::FabArrayId>_> *)
                 ((long)&(((this->m_mfid).
                           super_vector<amrex::Vector<amrex::FabArrayId,_std::allocator<amrex::FabArrayId>_>,_std::allocator<amrex::Vector<amrex::FabArrayId,_std::allocator<amrex::FabArrayId>_>_>_>
                           .
                           super__Vector_base<amrex::Vector<amrex::FabArrayId,_std::allocator<amrex::FabArrayId>_>,_std::allocator<amrex::Vector<amrex::FabArrayId,_std::allocator<amrex::FabArrayId>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->
                         super_vector<amrex::FabArrayId,_std::allocator<amrex::FabArrayId>_>).
                         super__Vector_base<amrex::FabArrayId,_std::allocator<amrex::FabArrayId>_>.
                         _M_impl.super__Vector_impl_data._M_start + lVar38));
      lVar30 = lVar30 + 1;
      lVar38 = lVar38 + 0x18;
    } while (lVar30 < this->m_amrlevel->level);
  }
  peVar8 = (this->m_leveldata->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.boxarray.m_ref.
           super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  uVar37 = (int)((long)(peVar8->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                       super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 *(long *)&(peVar8->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                           super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                           super__Vector_impl_data >> 2) * -0x49249249;
  if (0 < (int)uVar37) {
    lVar30 = 0;
    uVar36 = 0;
    do {
      if (*(int *)(*(long *)&(((this->m_leveldata->super_FabArray<amrex::FArrayBox>).
                               super_FabArrayBase.distributionMap.m_ref.
                               super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr)->m_pmap).super_vector<int,_std::allocator<int>_>.
                             super__Vector_base<int,_std::allocator<int>_>._M_impl + uVar36 * 4) ==
          iVar40) {
        iVar35 = (int)uVar36;
        tempUnfillable.btype.itype = 0;
        tempUnfillable._28_4_ = 0;
        tempUnfillable.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
        super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)0x0;
        tempUnfillable.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
        super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
        unfillableThisLevel.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
        super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
        unfillableThisLevel.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
        super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
        _M_start._0_4_ = 0;
        unfillableThisLevel.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
        super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
        _M_start._4_4_ = 0;
        unfillableThisLevel.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
        super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)0x0;
        tempUnfillable.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
        super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
        _M_start._0_4_ = iVar35;
        std::
        vector<amrex::Vector<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>,_std::allocator<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>_>_>,_std::allocator<amrex::Vector<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>,_std::allocator<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>_>_>_>_>
        ::~vector((vector<amrex::Vector<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>,_std::allocator<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>_>_>,_std::allocator<amrex::Vector<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>,_std::allocator<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>_>_>_>_>
                   *)&unfillableThisLevel);
        iVar19 = std::
                 _Rb_tree<int,std::pair<int_const,amrex::Vector<amrex::Vector<amrex::Vector<amrex::FillBoxId,std::allocator<amrex::FillBoxId>>,std::allocator<amrex::Vector<amrex::FillBoxId,std::allocator<amrex::FillBoxId>>>>,std::allocator<amrex::Vector<amrex::Vector<amrex::FillBoxId,std::allocator<amrex::FillBoxId>>,std::allocator<amrex::Vector<amrex::FillBoxId,std::allocator<amrex::FillBoxId>>>>>>>,std::_Select1st<std::pair<int_const,amrex::Vector<amrex::Vector<amrex::Vector<amrex::FillBoxId,std::allocator<amrex::FillBoxId>>,std::allocator<amrex::Vector<amrex::FillBoxId,std::allocator<amrex::FillBoxId>>>>,std::allocator<amrex::Vector<amrex::Vector<amrex::FillBoxId,std::allocator<amrex::FillBoxId>>,std::allocator<amrex::Vector<amrex::FillBoxId,std::allocator<amrex::FillBoxId>>>>>>>>,std::less<int>,std::allocator<std::pair<int_const,amrex::Vector<amrex::Vector<amrex::Vector<amrex::FillBoxId,std::allocator<amrex::FillBoxId>>,std::allocator<amrex::Vector<amrex::FillBoxId,std::allocator<amrex::FillBoxId>>>>,std::allocator<amrex::Vector<amrex::Vector<amrex::FillBoxId,std::allocator<amrex::FillBoxId>>,std::allocator<amrex::Vector<amrex::FillBoxId,std::allocator<amrex::FillBoxId>>>>>>>>>
                 ::
                 _M_emplace_hint_unique<std::pair<int_const,amrex::Vector<amrex::Vector<amrex::Vector<amrex::FillBoxId,std::allocator<amrex::FillBoxId>>,std::allocator<amrex::Vector<amrex::FillBoxId,std::allocator<amrex::FillBoxId>>>>,std::allocator<amrex::Vector<amrex::Vector<amrex::FillBoxId,std::allocator<amrex::FillBoxId>>,std::allocator<amrex::Vector<amrex::FillBoxId,std::allocator<amrex::FillBoxId>>>>>>>&>
                           ((_Rb_tree<int,std::pair<int_const,amrex::Vector<amrex::Vector<amrex::Vector<amrex::FillBoxId,std::allocator<amrex::FillBoxId>>,std::allocator<amrex::Vector<amrex::FillBoxId,std::allocator<amrex::FillBoxId>>>>,std::allocator<amrex::Vector<amrex::Vector<amrex::FillBoxId,std::allocator<amrex::FillBoxId>>,std::allocator<amrex::Vector<amrex::FillBoxId,std::allocator<amrex::FillBoxId>>>>>>>,std::_Select1st<std::pair<int_const,amrex::Vector<amrex::Vector<amrex::Vector<amrex::FillBoxId,std::allocator<amrex::FillBoxId>>,std::allocator<amrex::Vector<amrex::FillBoxId,std::allocator<amrex::FillBoxId>>>>,std::allocator<amrex::Vector<amrex::Vector<amrex::FillBoxId,std::allocator<amrex::FillBoxId>>,std::allocator<amrex::Vector<amrex::FillBoxId,std::allocator<amrex::FillBoxId>>>>>>>>,std::less<int>,std::allocator<std::pair<int_const,amrex::Vector<amrex::Vector<amrex::Vector<amrex::FillBoxId,std::allocator<amrex::FillBoxId>>,std::allocator<amrex::Vector<amrex::FillBoxId,std::allocator<amrex::FillBoxId>>>>,std::allocator<amrex::Vector<amrex::Vector<amrex::FillBoxId,std::allocator<amrex::FillBoxId>>,std::allocator<amrex::Vector<amrex::FillBoxId,std::allocator<amrex::FillBoxId>>>>>>>>>
                             *)&this->m_fbid,
                            (const_iterator)&(this->m_fbid)._M_t._M_impl.super__Rb_tree_header,
                            (pair<const_int,_amrex::Vector<amrex::Vector<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>,_std::allocator<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>_>_>,_std::allocator<amrex::Vector<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>,_std::allocator<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>_>_>_>_>_>
                             *)&tempUnfillable);
        std::
        vector<amrex::Vector<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>,_std::allocator<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>_>_>,_std::allocator<amrex::Vector<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>,_std::allocator<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>_>_>_>_>
        ::resize((vector<amrex::Vector<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>,_std::allocator<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>_>_>,_std::allocator<amrex::Vector<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>,_std::allocator<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>_>_>_>_>
                  *)&iVar19._M_node[1]._M_parent,(long)this->m_amrlevel->level + 1);
        unfillableThisLevel.btype.itype = 0;
        unfillableThisLevel._28_4_ = 0;
        unfillableThisLevel.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
        super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)0x0;
        unfillableThisLevel.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
        super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
        bl.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
        super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage._0_4_ = 0;
        bl.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
        super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage._4_4_ = 0;
        bl.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
        super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
        _M_start._0_4_ = 0;
        bl.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
        super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
        _M_start._4_4_ = 0;
        bl.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
        super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
        _M_finish._0_4_ = 0;
        bl.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
        super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
        _M_finish._4_4_ = 0;
        unfillableThisLevel.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
        super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
        _M_start._0_4_ = iVar35;
        std::
        vector<amrex::Vector<amrex::Box,_std::allocator<amrex::Box>_>,_std::allocator<amrex::Vector<amrex::Box,_std::allocator<amrex::Box>_>_>_>
        ::~vector((vector<amrex::Vector<amrex::Box,_std::allocator<amrex::Box>_>,_std::allocator<amrex::Vector<amrex::Box,_std::allocator<amrex::Box>_>_>_>
                   *)&bl);
        iVar20 = std::
                 _Rb_tree<int,std::pair<int_const,amrex::Vector<amrex::Vector<amrex::Box,std::allocator<amrex::Box>>,std::allocator<amrex::Vector<amrex::Box,std::allocator<amrex::Box>>>>>,std::_Select1st<std::pair<int_const,amrex::Vector<amrex::Vector<amrex::Box,std::allocator<amrex::Box>>,std::allocator<amrex::Vector<amrex::Box,std::allocator<amrex::Box>>>>>>,std::less<int>,std::allocator<std::pair<int_const,amrex::Vector<amrex::Vector<amrex::Box,std::allocator<amrex::Box>>,std::allocator<amrex::Vector<amrex::Box,std::allocator<amrex::Box>>>>>>>
                 ::
                 _M_emplace_hint_unique<std::pair<int_const,amrex::Vector<amrex::Vector<amrex::Box,std::allocator<amrex::Box>>,std::allocator<amrex::Vector<amrex::Box,std::allocator<amrex::Box>>>>>&>
                           ((_Rb_tree<int,std::pair<int_const,amrex::Vector<amrex::Vector<amrex::Box,std::allocator<amrex::Box>>,std::allocator<amrex::Vector<amrex::Box,std::allocator<amrex::Box>>>>>,std::_Select1st<std::pair<int_const,amrex::Vector<amrex::Vector<amrex::Box,std::allocator<amrex::Box>>,std::allocator<amrex::Vector<amrex::Box,std::allocator<amrex::Box>>>>>>,std::less<int>,std::allocator<std::pair<int_const,amrex::Vector<amrex::Vector<amrex::Box,std::allocator<amrex::Box>>,std::allocator<amrex::Vector<amrex::Box,std::allocator<amrex::Box>>>>>>>
                             *)&this->m_fbox,
                            (const_iterator)&(this->m_fbox)._M_t._M_impl.super__Rb_tree_header,
                            (pair<const_int,_amrex::Vector<amrex::Vector<amrex::Box,_std::allocator<amrex::Box>_>,_std::allocator<amrex::Vector<amrex::Box,_std::allocator<amrex::Box>_>_>_>_>
                             *)&unfillableThisLevel);
        std::
        vector<amrex::Vector<amrex::Box,_std::allocator<amrex::Box>_>,_std::allocator<amrex::Vector<amrex::Box,_std::allocator<amrex::Box>_>_>_>
        ::resize((vector<amrex::Vector<amrex::Box,_std::allocator<amrex::Box>_>,_std::allocator<amrex::Vector<amrex::Box,_std::allocator<amrex::Box>_>_>_>
                  *)&iVar20._M_node[1]._M_parent,(long)this->m_amrlevel->level + 1);
        iVar20 = std::
                 _Rb_tree<int,std::pair<int_const,amrex::Vector<amrex::Vector<amrex::Box,std::allocator<amrex::Box>>,std::allocator<amrex::Vector<amrex::Box,std::allocator<amrex::Box>>>>>,std::_Select1st<std::pair<int_const,amrex::Vector<amrex::Vector<amrex::Box,std::allocator<amrex::Box>>,std::allocator<amrex::Vector<amrex::Box,std::allocator<amrex::Box>>>>>>,std::less<int>,std::allocator<std::pair<int_const,amrex::Vector<amrex::Vector<amrex::Box,std::allocator<amrex::Box>>,std::allocator<amrex::Vector<amrex::Box,std::allocator<amrex::Box>>>>>>>
                 ::
                 _M_emplace_hint_unique<std::pair<int_const,amrex::Vector<amrex::Vector<amrex::Box,std::allocator<amrex::Box>>,std::allocator<amrex::Vector<amrex::Box,std::allocator<amrex::Box>>>>>&>
                           ((_Rb_tree<int,std::pair<int_const,amrex::Vector<amrex::Vector<amrex::Box,std::allocator<amrex::Box>>,std::allocator<amrex::Vector<amrex::Box,std::allocator<amrex::Box>>>>>,std::_Select1st<std::pair<int_const,amrex::Vector<amrex::Vector<amrex::Box,std::allocator<amrex::Box>>,std::allocator<amrex::Vector<amrex::Box,std::allocator<amrex::Box>>>>>>,std::less<int>,std::allocator<std::pair<int_const,amrex::Vector<amrex::Vector<amrex::Box,std::allocator<amrex::Box>>,std::allocator<amrex::Vector<amrex::Box,std::allocator<amrex::Box>>>>>>>
                             *)&this->m_cbox,
                            (const_iterator)&(this->m_cbox)._M_t._M_impl.super__Rb_tree_header,
                            (pair<const_int,_amrex::Vector<amrex::Vector<amrex::Box,_std::allocator<amrex::Box>_>,_std::allocator<amrex::Vector<amrex::Box,_std::allocator<amrex::Box>_>_>_>_>
                             *)&unfillableThisLevel);
        std::
        vector<amrex::Vector<amrex::Box,_std::allocator<amrex::Box>_>,_std::allocator<amrex::Vector<amrex::Box,_std::allocator<amrex::Box>_>_>_>
        ::resize((vector<amrex::Vector<amrex::Box,_std::allocator<amrex::Box>_>,_std::allocator<amrex::Vector<amrex::Box,_std::allocator<amrex::Box>_>_>_>
                  *)&iVar20._M_node[1]._M_parent,(long)this->m_amrlevel->level + 1);
        BATransformer::operator()
                  (&r,&(this->m_leveldata->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.
                       boxarray.m_bat,
                   (Box *)(*(long *)&(((this->m_leveldata->super_FabArray<amrex::FArrayBox>).
                                       super_FabArrayBase.boxarray.m_ref.
                                       super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>.
                                      _M_ptr)->m_abox).
                                     super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                     super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                                     _M_impl.super__Vector_impl_data + lVar30));
        iVar5 = this->m_growsize;
        bl.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
        super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
        _M_start._4_4_ = r.smallend.vect[0] - iVar5;
        bl.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
        super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
        _M_finish._0_4_ = r.smallend.vect[1] - iVar5;
        bl.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
        super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
        _M_finish._4_4_ = r.smallend.vect[2] - iVar5;
        bl.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
        super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage._0_4_ = r.bigend.vect[0] + iVar5;
        bl.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
        super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage._4_4_ = iVar5 + r.bigend.vect[1];
        bl.btype.itype = iVar5 + r.bigend.vect[2];
        bl._28_4_ = r.btype.itype;
        unfilledThisLevel.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
        super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)&this->m_ba;
        bl.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
        super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
        _M_start._0_4_ = iVar35;
        std::
        _Rb_tree<int,std::pair<int_const,amrex::Box>,std::_Select1st<std::pair<int_const,amrex::Box>>,std::less<int>,std::allocator<std::pair<int_const,amrex::Box>>>
        ::
        _M_insert_unique_<std::pair<int_const,amrex::Box>,std::_Rb_tree<int,std::pair<int_const,amrex::Box>,std::_Select1st<std::pair<int_const,amrex::Box>>,std::less<int>,std::allocator<std::pair<int_const,amrex::Box>>>::_Alloc_node>
                  ((_Rb_tree<int,std::pair<int_const,amrex::Box>,std::_Select1st<std::pair<int_const,amrex::Box>>,std::less<int>,std::allocator<std::pair<int_const,amrex::Box>>>
                    *)&this->m_ba,(const_iterator)&(this->m_ba)._M_t._M_impl.super__Rb_tree_header,
                   (pair<const_int,_amrex::Box> *)&bl,(_Alloc_node *)&unfilledThisLevel);
        std::
        vector<amrex::Vector<amrex::Box,_std::allocator<amrex::Box>_>,_std::allocator<amrex::Vector<amrex::Box,_std::allocator<amrex::Box>_>_>_>
        ::~vector((vector<amrex::Vector<amrex::Box,_std::allocator<amrex::Box>_>,_std::allocator<amrex::Vector<amrex::Box,_std::allocator<amrex::Box>_>_>_>
                   *)&unfillableThisLevel.m_lbox.
                      super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                      super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                      super__Vector_impl_data._M_finish);
        std::
        vector<amrex::Vector<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>,_std::allocator<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>_>_>,_std::allocator<amrex::Vector<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>,_std::allocator<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>_>_>_>_>
        ::~vector((vector<amrex::Vector<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>,_std::allocator<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>_>_>,_std::allocator<amrex::Vector<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>,_std::allocator<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>_>_>_>_>
                   *)&tempUnfillable.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                      super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                      super__Vector_impl_data._M_finish);
      }
      uVar36 = uVar36 + 1;
      lVar30 = lVar30 + 0x1c;
    } while ((uVar37 & 0x7fffffff) != uVar36);
  }
  BoxList::BoxList(&tempUnfillable,_btype);
  BoxList::BoxList(&unfillableThisLevel,_btype);
  unfilledThisLevel.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
  super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  unfilledThisLevel.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
  super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  unfilledThisLevel.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
  super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  crse_boxes.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
  super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  crse_boxes.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
  super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  crse_boxes.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
  super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  pshifts.super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
  super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pshifts.super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
  super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  pshifts.super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
  super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  pIVar21 = (pointer)operator_new(0x144);
  pshifts.super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
  super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
  super__Vector_impl_data._M_start = pIVar21;
  pIVar33 = pIVar21 + 0x1b;
  memset(pIVar21,0,0x144);
  pshifts.super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
  super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
  super__Vector_impl_data._M_finish = pIVar33;
  p_Var25 = (this->m_ba)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(this->m_ba)._M_t._M_impl.super__Rb_tree_header;
  pshifts.super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
  super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = pIVar33;
  if ((_Rb_tree_header *)p_Var25 == p_Var1) {
    (this->m_mfcd).super_FabArrayCopyDescriptor<amrex::FArrayBox>.dataAvailable = true;
  }
  else {
    lVar27 = (long)iVar41 * 0xe0 + lVar27;
    this_02 = (Box *)(lVar27 + 0x10);
    do {
      bxidx = p_Var25[1]._M_color;
      if (unfilledThisLevel.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
          super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          unfilledThisLevel.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
          super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
          super__Vector_impl_data._M_start) {
        unfilledThisLevel.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
        super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
        _M_finish = unfilledThisLevel.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                    super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                    super__Vector_impl_data._M_start;
      }
      __args = &p_Var25[1].field_0x4;
      if (unfilledThisLevel.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
          super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          unfilledThisLevel.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
          super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<amrex::Box,std::allocator<amrex::Box>>::_M_realloc_insert<amrex::Box_const&>
                  ((vector<amrex::Box,std::allocator<amrex::Box>> *)&unfilledThisLevel,
                   (iterator)
                   unfilledThisLevel.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                   super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                   super__Vector_impl_data._M_finish,(Box *)__args);
      }
      else {
        uVar11 = *(undefined8 *)__args;
        uVar12 = *(undefined8 *)((long)&p_Var25[1]._M_parent + 4);
        p_Var13 = p_Var25[1]._M_right;
        *(_Base_ptr *)
         ((unfilledThisLevel.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
           super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
           super__Vector_impl_data._M_finish)->bigend).vect = p_Var25[1]._M_left;
        *(_Base_ptr *)
         (((unfilledThisLevel.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
            super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
            super__Vector_impl_data._M_finish)->bigend).vect + 2) = p_Var13;
        *(undefined8 *)
         ((unfilledThisLevel.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
           super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
           super__Vector_impl_data._M_finish)->smallend).vect = uVar11;
        *(undefined8 *)
         (((unfilledThisLevel.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
            super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
            super__Vector_impl_data._M_finish)->smallend).vect + 2) = uVar12;
        unfilledThisLevel.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
        super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
        _M_finish = unfilledThisLevel.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                    super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                    super__Vector_impl_data._M_finish + 1;
      }
      bVar17 = Box::contains(this_02,(Box *)__args);
      if ((!bVar17) &&
         (((Box::operator&=(unfilledThisLevel.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                            super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                            super__Vector_impl_data._M_finish + -1,this_02),
           *(char *)((long)_Var7.
                           super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                           .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl + 0x61) !=
           '\0' || (*(char *)((long)_Var7.
                                    super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                                    .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl +
                             0x62) != '\0')) ||
          (*(char *)((long)_Var7.
                           super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                           .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl + 99) ==
           '\x01')))) {
        Geometry::periodicShift
                  ((Geometry *)
                   ((long)_Var7.
                          super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                          .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl + 0x10),
                   this_02,(Box *)__args,&pshifts);
        pIVar21 = pshifts.super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                  super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        for (pIVar33 = pshifts.super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                       super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
                       super__Vector_impl_data._M_start; pIVar33 != pIVar21; pIVar33 = pIVar33 + 1)
        {
          uVar11 = *(undefined8 *)((long)&p_Var25[1]._M_parent + 4);
          r.bigend.vect[1] = (int)((ulong)p_Var25[1]._M_left >> 0x20);
          r.bigend.vect[2] = (int)p_Var25[1]._M_right;
          r.btype.itype = (uint)((ulong)p_Var25[1]._M_right >> 0x20);
          r.smallend.vect[2] = (int)uVar11;
          r.bigend.vect[0] = (int)((ulong)uVar11 >> 0x20);
          iVar40 = (int)*(undefined8 *)__args + (int)*(undefined8 *)pIVar33->vect;
          iVar41 = (int)((ulong)*(undefined8 *)__args >> 0x20) +
                   (int)((ulong)*(undefined8 *)pIVar33->vect >> 0x20);
          r.smallend.vect[2] = r.smallend.vect[2] + pIVar33->vect[2];
          r.bigend.vect[0] = r.bigend.vect[0] + pIVar33->vect[0];
          r.bigend.vect[1] = r.bigend.vect[1] + pIVar33->vect[1];
          r.bigend.vect[2] = r.bigend.vect[2] + pIVar33->vect[2];
          r.smallend.vect[0] = (this_02->smallend).vect[0];
          if (r.smallend.vect[0] < iVar40) {
            r.smallend.vect[0] = iVar40;
          }
          r.smallend.vect[1] = *(int *)(lVar27 + 0x14);
          if (*(int *)(lVar27 + 0x14) < iVar41) {
            r.smallend.vect[1] = iVar41;
          }
          if (r.smallend.vect[2] <= *(int *)(lVar27 + 0x18)) {
            r.smallend.vect[2] = *(int *)(lVar27 + 0x18);
          }
          if (*(int *)(lVar27 + 0x1c) <= r.bigend.vect[0]) {
            r.bigend.vect[0] = *(int *)(lVar27 + 0x1c);
          }
          if (*(int *)(lVar27 + 0x20) <= r.bigend.vect[1]) {
            r.bigend.vect[1] = *(int *)(lVar27 + 0x20);
          }
          if (*(int *)(lVar27 + 0x24) <= r.bigend.vect[2]) {
            r.bigend.vect[2] = *(int *)(lVar27 + 0x24);
          }
          iVar40 = r.smallend.vect[0];
          if (_btype.itype == 7) {
            lVar30 = 0;
            do {
              iVar40 = -1;
              pBVar28 = (Box *)&r.bigend;
              if (pIVar33->vect[lVar30] < 1) {
                if (pIVar33->vect[lVar30] < 0) {
                  iVar40 = 1;
                  pBVar28 = &r;
                  goto LAB_005b88eb;
                }
              }
              else {
LAB_005b88eb:
                (pBVar28->smallend).vect[lVar30] = (pBVar28->smallend).vect[lVar30] + iVar40;
              }
              lVar30 = lVar30 + 1;
            } while (lVar30 != 3);
            iVar40 = r.smallend.vect[0];
          }
          if (((iVar40 <= r.bigend.vect[0]) && (r.smallend.vect[1] <= r.bigend.vect[1])) &&
             ((r.smallend.vect[2] <= r.bigend.vect[2] && (r.btype.itype < 8)))) {
            boxDiff(&bl,&r,(Box *)__args);
            std::vector<amrex::Box,std::allocator<amrex::Box>>::
            _M_range_insert<__gnu_cxx::__normal_iterator<amrex::Box*,std::vector<amrex::Box,std::allocator<amrex::Box>>>>
                      ((vector<amrex::Box,std::allocator<amrex::Box>> *)&unfilledThisLevel,
                       unfilledThisLevel.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                       super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                       super__Vector_impl_data._M_finish,
                       CONCAT44(bl.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                                super__Vector_impl_data._M_start._4_4_,
                                (int)bl.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>
                                     .super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                                     _M_impl.super__Vector_impl_data._M_start),
                       CONCAT44(bl.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                                super__Vector_impl_data._M_finish._4_4_,
                                (int)bl.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>
                                     .super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                                     _M_impl.super__Vector_impl_data._M_finish));
            pvVar15 = (void *)CONCAT44(bl.m_lbox.
                                       super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                       super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                                       _M_impl.super__Vector_impl_data._M_start._4_4_,
                                       (int)bl.m_lbox.
                                            super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                            super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>
                                            ._M_impl.super__Vector_impl_data._M_start);
            if (pvVar15 != (void *)0x0) {
              operator_delete(pvVar15,CONCAT44(bl.m_lbox.
                                               super_vector<amrex::Box,_std::allocator<amrex::Box>_>
                                               .
                                               super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>
                                               ._M_impl.super__Vector_impl_data._M_end_of_storage.
                                               _4_4_,(int)bl.m_lbox.
                                                                                                                    
                                                  super_vector<amrex::Box,_std::allocator<amrex::Box>_>
                                                  .
                                                  super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                              ) - (long)pvVar15);
            }
          }
        }
      }
      pmVar22 = std::
                map<int,_amrex::Vector<amrex::Vector<amrex::Box,_std::allocator<amrex::Box>_>,_std::allocator<amrex::Vector<amrex::Box,_std::allocator<amrex::Box>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_amrex::Vector<amrex::Vector<amrex::Box,_std::allocator<amrex::Box>_>,_std::allocator<amrex::Vector<amrex::Box,_std::allocator<amrex::Box>_>_>_>_>_>_>
                ::operator[](&this->m_cbox,&bxidx);
      pmVar23 = std::
                map<int,_amrex::Vector<amrex::Vector<amrex::Box,_std::allocator<amrex::Box>_>,_std::allocator<amrex::Vector<amrex::Box,_std::allocator<amrex::Box>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_amrex::Vector<amrex::Vector<amrex::Box,_std::allocator<amrex::Box>_>,_std::allocator<amrex::Vector<amrex::Box,_std::allocator<amrex::Box>_>_>_>_>_>_>
                ::operator[](&this->m_fbox,&bxidx);
      pmVar24 = std::
                map<int,_amrex::Vector<amrex::Vector<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>,_std::allocator<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>_>_>,_std::allocator<amrex::Vector<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>,_std::allocator<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>_>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_amrex::Vector<amrex::Vector<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>,_std::allocator<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>_>_>,_std::allocator<amrex::Vector<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>,_std::allocator<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>_>_>_>_>_>_>_>
                ::operator[](&this->m_fbid,&bxidx);
      uVar36 = (ulong)this->m_amrlevel->level;
      if (-1 < (long)uVar36) {
        do {
          BoxList::clear(&unfillableThisLevel);
          _Var9.super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>._M_t.
          super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>.
          super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl =
               (local_90->
               super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
               ).
               super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar36]._M_t.
               super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>;
          cVar4 = '\x01';
          if ((*(char *)((long)_Var9.
                               super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                               .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl + 0x61)
               == '\0') &&
             (*(char *)((long)_Var9.
                              super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                              .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl + 0x62)
              == '\0')) {
            cVar4 = *(char *)((long)_Var9.
                                    super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                                    .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl +
                             99);
          }
          iVar40 = this->m_index;
          lVar30 = *(long *)((long)_Var9.
                                   super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                                   .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl +
                            0x170);
          pvVar34 = &(pmVar23->
                     super_vector<amrex::Vector<amrex::Box,_std::allocator<amrex::Box>_>,_std::allocator<amrex::Vector<amrex::Box,_std::allocator<amrex::Box>_>_>_>
                     ).
                     super__Vector_base<amrex::Vector<amrex::Box,_std::allocator<amrex::Box>_>,_std::allocator<amrex::Vector<amrex::Box,_std::allocator<amrex::Box>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar36].
                     super_vector<amrex::Box,_std::allocator<amrex::Box>_>;
          std::vector<amrex::Box,_std::allocator<amrex::Box>_>::operator=
                    (pvVar34,&unfilledThisLevel.
                              super_vector<amrex::Box,_std::allocator<amrex::Box>_>);
          if (crse_boxes.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
              super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
              super__Vector_impl_data._M_finish !=
              crse_boxes.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
              super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
              super__Vector_impl_data._M_start) {
            crse_boxes.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
            super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 crse_boxes.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                 super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                 super__Vector_impl_data._M_start;
          }
          lVar38 = (long)iVar40 * 0xe0;
          this_00 = (StateData *)(lVar30 + lVar38);
          pBVar28 = (Box *)(lVar38 + lVar30 + 0x10);
          pBVar39 = (pvVar34->super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>)._M_impl.
                    super__Vector_impl_data._M_start;
          pBVar10 = (pvVar34->super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>)._M_impl.
                    super__Vector_impl_data._M_finish;
          pBVar32 = crse_boxes.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                    super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                    super__Vector_impl_data._M_start;
          if (pBVar39 != pBVar10) {
            do {
              if (crse_boxes.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                  super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                  super__Vector_impl_data._M_finish ==
                  crse_boxes.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                  super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<amrex::Box,std::allocator<amrex::Box>>::
                _M_realloc_insert<amrex::Box_const&>
                          ((vector<amrex::Box,std::allocator<amrex::Box>> *)&crse_boxes,
                           (iterator)
                           crse_boxes.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                           super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                           super__Vector_impl_data._M_finish,pBVar39);
              }
              else {
                uVar11 = *(undefined8 *)(pBVar39->smallend).vect;
                uVar12 = *(undefined8 *)((pBVar39->smallend).vect + 2);
                uVar14 = *(undefined8 *)((pBVar39->bigend).vect + 2);
                *(undefined8 *)
                 ((crse_boxes.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                   super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                   super__Vector_impl_data._M_finish)->bigend).vect =
                     *(undefined8 *)(pBVar39->bigend).vect;
                *(undefined8 *)
                 (((crse_boxes.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                    super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                    super__Vector_impl_data._M_finish)->bigend).vect + 2) = uVar14;
                *(undefined8 *)
                 ((crse_boxes.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                   super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                   super__Vector_impl_data._M_finish)->smallend).vect = uVar11;
                *(undefined8 *)
                 (((crse_boxes.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                    super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                    super__Vector_impl_data._M_finish)->smallend).vect + 2) = uVar12;
                crse_boxes.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                super__Vector_impl_data._M_finish =
                     crse_boxes.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                     super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                     super__Vector_impl_data._M_finish + 1;
              }
              if (uVar36 != (uint)this->m_amrlevel->level) {
                (*((*local_88)->super_InterpBase)._vptr_InterpBase[3])
                          (&bl,*local_88,pBVar39,
                           (long)_Var9.
                                 super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                                 .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl +
                           0x164);
                *(ulong *)crse_boxes.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                          super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                          super__Vector_impl_data._M_finish[-1].bigend.vect =
                     CONCAT44((int)bl.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                   super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                                   _M_impl.super__Vector_impl_data._M_end_of_storage,
                              bl.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                              super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                              super__Vector_impl_data._M_finish._4_4_);
                *(ulong *)(crse_boxes.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                           super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                           super__Vector_impl_data._M_finish[-1].bigend.vect + 2) =
                     CONCAT44(bl.btype.itype,
                              bl.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                              super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage._4_4_);
                *(ulong *)crse_boxes.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                          super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                          super__Vector_impl_data._M_finish[-1].smallend.vect =
                     CONCAT44(bl.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                              super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                              super__Vector_impl_data._M_start._4_4_,
                              (int)bl.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                   super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                                   _M_impl.super__Vector_impl_data._M_start);
                *(ulong *)(crse_boxes.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                           super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                           super__Vector_impl_data._M_finish[-1].smallend.vect + 2) =
                     CONCAT44(bl.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                              super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                              super__Vector_impl_data._M_finish._4_4_,
                              (int)bl.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                   super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                                   _M_impl.super__Vector_impl_data._M_finish);
                if ((cVar4 != '\0') &&
                   ((((((int)bl.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                             super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                             super__Vector_impl_data._M_start < (pBVar28->smallend).vect[0] ||
                       (bl.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                        super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                        super__Vector_impl_data._M_start._4_4_ < (this_00->domain).smallend.vect[1])
                       ) || ((int)bl.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                  super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                                  _M_impl.super__Vector_impl_data._M_finish <
                             (this_00->domain).smallend.vect[2])) ||
                     (((this_00->domain).bigend.vect[0] <
                       bl.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                       super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                       super__Vector_impl_data._M_finish._4_4_ ||
                      ((this_00->domain).bigend.vect[1] <
                       (int)bl.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                            super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage)))) ||
                    ((this_00->domain).bigend.vect[2] <
                     bl.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                     super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage._4_4_)))) {
                  Geometry::periodicShift
                            ((Geometry *)
                             ((long)_Var9.
                                    super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                                    .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl +
                             0x10),pBVar28,(Box *)&bl,&pshifts);
                  pIVar21 = pshifts.super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                            super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                            _M_impl.super__Vector_impl_data._M_finish;
                  for (pIVar33 = pshifts.
                                 super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                                 super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>
                                 ._M_impl.super__Vector_impl_data._M_start; pIVar33 != pIVar21;
                      pIVar33 = pIVar33 + 1) {
                    r.btype = bl.btype;
                    iVar40 = (int)bl.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                  super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                                  _M_impl.super__Vector_impl_data._M_start +
                             (int)*(undefined8 *)pIVar33->vect;
                    iVar41 = bl.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                             super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                             super__Vector_impl_data._M_start._4_4_ +
                             (int)((ulong)*(undefined8 *)pIVar33->vect >> 0x20);
                    r.smallend.vect[2] =
                         (int)bl.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                              super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                              super__Vector_impl_data._M_finish + pIVar33->vect[2];
                    r.bigend.vect[0] =
                         bl.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                         super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                         super__Vector_impl_data._M_finish._4_4_ + pIVar33->vect[0];
                    r.bigend.vect[1] =
                         (int)bl.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                              super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage + pIVar33->vect[1];
                    r.bigend.vect[2] =
                         bl.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                         super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage._4_4_ + pIVar33->vect[2];
                    r.smallend.vect[0] = (this_00->domain).smallend.vect[0];
                    if (r.smallend.vect[0] < iVar40) {
                      r.smallend.vect[0] = iVar40;
                    }
                    r.smallend.vect[1] = (this_00->domain).smallend.vect[1];
                    if (r.smallend.vect[1] < iVar41) {
                      r.smallend.vect[1] = iVar41;
                    }
                    iVar40 = (this_00->domain).smallend.vect[2];
                    if (r.smallend.vect[2] <= iVar40) {
                      r.smallend.vect[2] = iVar40;
                    }
                    iVar40 = (this_00->domain).bigend.vect[0];
                    if (iVar40 <= r.bigend.vect[0]) {
                      r.bigend.vect[0] = iVar40;
                    }
                    iVar40 = (this_00->domain).bigend.vect[1];
                    if (iVar40 <= r.bigend.vect[1]) {
                      r.bigend.vect[1] = iVar40;
                    }
                    iVar40 = (this_00->domain).bigend.vect[2];
                    if (iVar40 <= r.bigend.vect[2]) {
                      r.bigend.vect[2] = iVar40;
                    }
                    iVar40 = r.smallend.vect[0];
                    if (_btype.itype == 7) {
                      lVar30 = 0;
                      do {
                        iVar40 = -1;
                        pBVar29 = (Box *)&r.bigend;
                        if (pIVar33->vect[lVar30] < 1) {
                          if (pIVar33->vect[lVar30] < 0) {
                            iVar40 = 1;
                            pBVar29 = &r;
                            goto LAB_005b852a;
                          }
                        }
                        else {
LAB_005b852a:
                          (pBVar29->smallend).vect[lVar30] =
                               (pBVar29->smallend).vect[lVar30] + iVar40;
                        }
                        lVar30 = lVar30 + 1;
                      } while (lVar30 != 3);
                      iVar40 = r.smallend.vect[0];
                    }
                    if (((iVar40 <= r.bigend.vect[0]) && (r.smallend.vect[1] <= r.bigend.vect[1]))
                       && ((r.smallend.vect[2] <= r.bigend.vect[2] && (bl.btype.itype < 8)))) {
                      if (crse_boxes.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                          super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                          super__Vector_impl_data._M_finish ==
                          crse_boxes.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                          super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage) {
                        std::vector<amrex::Box,std::allocator<amrex::Box>>::
                        _M_realloc_insert<amrex::Box_const&>
                                  ((vector<amrex::Box,std::allocator<amrex::Box>> *)&crse_boxes,
                                   (iterator)
                                   crse_boxes.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                   super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                                   _M_impl.super__Vector_impl_data._M_finish,&r);
                      }
                      else {
                        *(ulong *)((crse_boxes.super_vector<amrex::Box,_std::allocator<amrex::Box>_>
                                    .super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                                    _M_impl.super__Vector_impl_data._M_finish)->bigend).vect =
                             CONCAT44(r.bigend.vect[1],r.bigend.vect[0]);
                        *(ulong *)(((crse_boxes.
                                     super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                     super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                                     _M_impl.super__Vector_impl_data._M_finish)->bigend).vect + 2) =
                             CONCAT44(bl.btype.itype,r.bigend.vect[2]);
                        *(undefined8 *)
                         ((crse_boxes.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                           super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                           super__Vector_impl_data._M_finish)->smallend).vect =
                             r.smallend.vect._0_8_;
                        *(ulong *)(((crse_boxes.
                                     super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                     super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                                     _M_impl.super__Vector_impl_data._M_finish)->smallend).vect + 2)
                             = CONCAT44(r.bigend.vect[0],r.smallend.vect[2]);
                        crse_boxes.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                        super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                        super__Vector_impl_data._M_finish =
                             crse_boxes.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                             super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                             super__Vector_impl_data._M_finish + 1;
                      }
                    }
                  }
                }
              }
              pBVar39 = pBVar39 + 1;
              pBVar32 = crse_boxes.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                        super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                        super__Vector_impl_data._M_finish;
            } while (pBVar39 != pBVar10);
          }
          this_03 = &(pmVar24->
                     super_vector<amrex::Vector<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>,_std::allocator<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>_>_>,_std::allocator<amrex::Vector<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>,_std::allocator<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>_>_>_>_>
                     ).
                     super__Vector_base<amrex::Vector<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>,_std::allocator<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>_>_>,_std::allocator<amrex::Vector<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>,_std::allocator<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar36].
                     super_vector<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>,_std::allocator<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>_>_>
          ;
          pvVar34 = &(pmVar22->
                     super_vector<amrex::Vector<amrex::Box,_std::allocator<amrex::Box>_>,_std::allocator<amrex::Vector<amrex::Box,_std::allocator<amrex::Box>_>_>_>
                     ).
                     super__Vector_base<amrex::Vector<amrex::Box,_std::allocator<amrex::Box>_>,_std::allocator<amrex::Vector<amrex::Box,_std::allocator<amrex::Box>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar36].
                     super_vector<amrex::Box,_std::allocator<amrex::Box>_>;
          std::
          vector<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>,_std::allocator<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>_>_>
          ::resize(this_03,((long)pBVar32 -
                            (long)crse_boxes.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                  super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                                  _M_impl.super__Vector_impl_data._M_start >> 2) *
                           0x6db6db6db6db6db7);
          std::vector<amrex::Box,_std::allocator<amrex::Box>_>::resize
                    (pvVar34,((long)crse_boxes.super_vector<amrex::Box,_std::allocator<amrex::Box>_>
                                    .super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                                    _M_impl.super__Vector_impl_data._M_finish -
                              (long)crse_boxes.super_vector<amrex::Box,_std::allocator<amrex::Box>_>
                                    .super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                                    _M_impl.super__Vector_impl_data._M_start >> 2) *
                             0x6db6db6db6db6db7);
          uVar37 = (int)((long)(pvVar34->super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>
                               )._M_impl.super__Vector_impl_data._M_finish -
                         (long)(pvVar34->super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>
                               )._M_impl.super__Vector_impl_data._M_start >> 2) * -0x49249249;
          if (0 < (int)uVar37) {
            uVar31 = (ulong)(uVar37 & 0x7fffffff);
            lVar38 = 0;
            lVar30 = 0;
            do {
              pBVar39 = (pvVar34->super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>).
                        _M_impl.super__Vector_impl_data._M_start;
              puVar2 = (undefined8 *)
                       ((long)((crse_boxes.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                                super__Vector_impl_data._M_start)->smallend).vect + lVar30);
              uVar11 = *puVar2;
              uVar12 = puVar2[1];
              puVar2 = (undefined8 *)
                       ((long)((crse_boxes.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                                super__Vector_impl_data._M_start)->bigend).vect + lVar30);
              uVar14 = puVar2[1];
              puVar3 = (undefined8 *)((long)(pBVar39->bigend).vect + lVar30);
              *puVar3 = *puVar2;
              puVar3[1] = uVar14;
              puVar2 = (undefined8 *)((long)(pBVar39->smallend).vect + lVar30);
              *puVar2 = uVar11;
              puVar2[1] = uVar12;
              StateData::InterpAddBox
                        (this_00,&this->m_mfcd,
                         (this->m_mfid).
                         super_vector<amrex::Vector<amrex::FabArrayId,_std::allocator<amrex::FabArrayId>_>,_std::allocator<amrex::Vector<amrex::FabArrayId,_std::allocator<amrex::FabArrayId>_>_>_>
                         .
                         super__Vector_base<amrex::Vector<amrex::FabArrayId,_std::allocator<amrex::FabArrayId>_>,_std::allocator<amrex::Vector<amrex::FabArrayId,_std::allocator<amrex::FabArrayId>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + uVar36,&tempUnfillable,
                         (Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_> *)
                         ((long)&(((this_03->
                                   super__Vector_base<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>,_std::allocator<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>_>_>
                                   )._M_impl.super__Vector_impl_data._M_start)->
                                 super_vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>).
                                 super__Vector_base<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>
                                 ._M_impl.super__Vector_impl_data._M_start + lVar38),
                         (Box *)((long)(((pvVar34->
                                         super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>
                                         )._M_impl.super__Vector_impl_data._M_start)->smallend).vect
                                + lVar30),this->m_time,this->m_scomp,0,this->m_ncomp,extrap);
              BoxList::catenate(&unfillableThisLevel,&tempUnfillable);
              lVar30 = lVar30 + 0x1c;
              lVar38 = lVar38 + 0x18;
              uVar31 = uVar31 - 1;
            } while (uVar31 != 0);
          }
          BoxList::intersect(&unfillableThisLevel,pBVar28);
          pBVar10 = unfillableThisLevel.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>
                    .super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                    super__Vector_impl_data._M_finish;
          pBVar39 = (pointer)CONCAT44(unfillableThisLevel.m_lbox.
                                      super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                      super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                                      _M_impl.super__Vector_impl_data._M_start._4_4_,
                                      (int)unfillableThisLevel.m_lbox.
                                           super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                           super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>
                                           ._M_impl.super__Vector_impl_data._M_start);
          if (pBVar39 ==
              unfillableThisLevel.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
              super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
              super__Vector_impl_data._M_finish) break;
          if (unfilledThisLevel.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
              super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
              super__Vector_impl_data._M_finish !=
              unfilledThisLevel.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
              super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
              super__Vector_impl_data._M_start) {
            unfilledThisLevel.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
            super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 unfilledThisLevel.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                 super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                 super__Vector_impl_data._M_start;
          }
          std::vector<amrex::Box,std::allocator<amrex::Box>>::
          _M_range_insert<__gnu_cxx::__normal_iterator<amrex::Box*,std::vector<amrex::Box,std::allocator<amrex::Box>>>>
                    ((vector<amrex::Box,std::allocator<amrex::Box>> *)&unfilledThisLevel,
                     unfilledThisLevel.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                     super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                     super__Vector_impl_data._M_start,pBVar39,
                     unfillableThisLevel.m_lbox.
                     super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                     super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                     super__Vector_impl_data._M_finish);
          if (((long)uVar36 < 1) || (uVar36 = uVar36 - 1, pBVar39 == pBVar10)) break;
        } while( true );
      }
      p_Var25 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var25);
    } while ((_Rb_tree_header *)p_Var25 != p_Var1);
    (this->m_mfcd).super_FabArrayCopyDescriptor<amrex::FArrayBox>.dataAvailable = true;
    pIVar21 = pshifts.super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
              super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (pshifts.super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
        super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
        super__Vector_impl_data._M_start == (pointer)0x0) goto LAB_005b89a6;
  }
  operator_delete(pIVar21,(long)pshifts.
                                super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                                super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage - (long)pIVar21);
LAB_005b89a6:
  if (crse_boxes.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
      super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(crse_boxes.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                    super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)crse_boxes.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                          super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)crse_boxes.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                          super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (unfilledThisLevel.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
      super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(unfilledThisLevel.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                    super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)unfilledThisLevel.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                          super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)unfilledThisLevel.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                          super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  pvVar15 = (void *)CONCAT44(unfillableThisLevel.m_lbox.
                             super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                             super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                             super__Vector_impl_data._M_start._4_4_,
                             (int)unfillableThisLevel.m_lbox.
                                  super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                  super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
  if (pvVar15 != (void *)0x0) {
    operator_delete(pvVar15,(long)unfillableThisLevel.m_lbox.
                                  super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                  super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage - (long)pvVar15)
    ;
  }
  pvVar15 = (void *)CONCAT44(tempUnfillable.m_lbox.
                             super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                             super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                             super__Vector_impl_data._M_start._4_4_,
                             (int)tempUnfillable.m_lbox.
                                  super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                  super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
  if (pvVar15 != (void *)0x0) {
    operator_delete(pvVar15,(long)tempUnfillable.m_lbox.
                                  super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                  super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage - (long)pvVar15)
    ;
  }
  return;
}

Assistant:

void
FillPatchIteratorHelper::Initialize (int           boxGrow,
                                     Real          time,
                                     int           idx,
                                     int           scomp,
                                     int           ncomp,
                                     InterpBase*   mapper)
{
    BL_PROFILE("FillPatchIteratorHelper::Initialize()");

    BL_ASSERT(mapper);
    BL_ASSERT(scomp >= 0);
    BL_ASSERT(ncomp >= 1);
    BL_ASSERT(AmrLevel::desc_lst[idx].inRange(scomp,ncomp));
    BL_ASSERT(0 <= idx && idx < AmrLevel::desc_lst.size());

    m_map          = dynamic_cast<Interpolater*>(mapper);
    AMREX_ALWAYS_ASSERT_WITH_MESSAGE(m_map, "Cannot use MFInterpolater without proper nesting");
    m_time         = time;
    m_growsize     = boxGrow;
    m_index        = idx;
    m_scomp        = scomp;
    m_ncomp        = ncomp;
    m_FixUpCorners = NeedToTouchUpPhysCorners(m_amrlevel.geom);

    const int         MyProc     = ParallelDescriptor::MyProc();
    auto&             amrLevels  = m_amrlevel.parent->getAmrLevels();
    const AmrLevel&   topLevel   = *amrLevels[m_amrlevel.level];
    const Box&        topPDomain = topLevel.state[m_index].getDomain();
    const IndexType&  boxType    = m_leveldata.boxArray().ixType();
    const bool        extrap     = AmrLevel::desc_lst[m_index].extrap();
    //
    // Check that the interpolaters are identical.
    //
    BL_ASSERT(AmrLevel::desc_lst[m_index].identicalInterps(scomp,ncomp));

    for (int l = 0; l <= m_amrlevel.level; ++l)
    {
        amrLevels[l]->state[m_index].RegisterData(m_mfcd, m_mfid[l]);
    }
    for (int i = 0, N = m_leveldata.boxArray().size(); i < N; ++i)
    {
        //
        // A couple typedefs we'll use in the next code segment.
        //
        typedef std::map<int,Vector<Vector<Box> > >::value_type IntAABoxMapValType;

        typedef std::map<int,Vector<Vector<Vector<FillBoxId> > > >::value_type IntAAAFBIDMapValType;

        if (m_leveldata.DistributionMap()[i] != MyProc) continue;
        //
        // Insert with a hint since the indices are ordered lowest to highest.
        //
        IntAAAFBIDMapValType v1(i,Vector<Vector<Vector<FillBoxId> > >());

        m_fbid.insert(m_fbid.end(),v1)->second.resize(m_amrlevel.level+1);

        IntAABoxMapValType v2(i,Vector<Vector<Box> >());

        m_fbox.insert(m_fbox.end(),v2)->second.resize(m_amrlevel.level+1);
        m_cbox.insert(m_cbox.end(),v2)->second.resize(m_amrlevel.level+1);

        m_ba.insert(m_ba.end(),std::map<int,Box>::value_type(i,amrex::grow(m_leveldata.boxArray()[i],m_growsize)));
    }

    BoxList        tempUnfillable(boxType);
    BoxList        unfillableThisLevel(boxType);
    Vector<Box>     unfilledThisLevel;
    Vector<Box>     crse_boxes;
    Vector<IntVect> pshifts(27);

    for (std::map<int,Box>::const_iterator it = m_ba.begin(), End = m_ba.end();
         it != End;
         ++it)
    {
        const int  bxidx = it->first;
        const Box& box   = it->second;

        unfilledThisLevel.clear();
        unfilledThisLevel.push_back(box);

        if (!topPDomain.contains(box))
        {
            unfilledThisLevel.back() &= topPDomain;

            if (topLevel.geom.isAnyPeriodic())
            {
                //
                // May need to add additional unique pieces of valid region
                // in order to do periodic copies into ghost cells.
                //
                topLevel.geom.periodicShift(topPDomain,box,pshifts);

                for (const auto& iv : pshifts)
                {
                    Box shbox = box + iv;
                    shbox    &= topPDomain;

                    if (boxType.nodeCentered())
                    {
                        for (int dir = 0; dir < AMREX_SPACEDIM; dir++)
                        {
                            if (iv[dir] > 0)
                            {
                                shbox.growHi(dir,-1);
                            }
                            else if (iv[dir] < 0)
                            {
                                shbox.growLo(dir,-1);
                            }
                        }
                    }

                    if (shbox.ok())
                    {
                        BoxList bl = amrex::boxDiff(shbox,box);

                        unfilledThisLevel.insert(unfilledThisLevel.end(), bl.begin(), bl.end());
                    }
                }
            }
        }

        // cells outside physical boundaries are not included in unfilledThisLevel

        bool Done = false;

        Vector< Vector<Box> >&                TheCrseBoxes = m_cbox[bxidx];
        Vector< Vector<Box> >&                TheFineBoxes = m_fbox[bxidx];
        Vector< Vector< Vector<FillBoxId> > >& TheFBIDs     = m_fbid[bxidx];

        for (int l = m_amrlevel.level; l >= 0 && !Done; --l)
        {
            unfillableThisLevel.clear();

            AmrLevel&       theAmrLevel = *amrLevels[l];
            StateData&      theState    = theAmrLevel.state[m_index];
            const Box&      thePDomain  = theState.getDomain();
            const Geometry& theGeom     = theAmrLevel.geom;
            const bool      is_periodic = theGeom.isAnyPeriodic();
            const IntVect&  fine_ratio  = theAmrLevel.fine_ratio;
            Vector<Box>&     FineBoxes   = TheFineBoxes[l];
            //
            // These are the boxes on this level contained in thePDomain
            // that need to be filled in order to directly fill at the
            // highest level or to interpolate up to the next higher level.
            //
            FineBoxes = unfilledThisLevel;
            //
            // Now build coarse boxes needed to interpolate to fine.
            //
            // If we're periodic and we're not at the finest level, we may
            // need to get some additional data at this level in order to
            // properly fill the CoarseBox()d versions of the fineboxes.
            //
            crse_boxes.clear();

            for (const auto& fbx : FineBoxes)
            {
                crse_boxes.push_back(fbx);

                if (l != m_amrlevel.level)
                {
                    const Box& cbox = m_map->CoarseBox(fbx,fine_ratio);

                    crse_boxes.back() = cbox;

                    if (is_periodic && !thePDomain.contains(cbox))
                    {
                        theGeom.periodicShift(thePDomain,cbox,pshifts);

                        for (const auto& iv : pshifts)
                        {
                            Box shbox = cbox + iv;
                            shbox    &= thePDomain;

                            if (boxType.nodeCentered())
                            {
                                for (int dir = 0; dir < AMREX_SPACEDIM; dir++)
                                {
                                    if (iv[dir] > 0)
                                    {
                                        shbox.growHi(dir,-1);
                                    }
                                    else if (iv[dir] < 0)
                                    {
                                        shbox.growLo(dir,-1);
                                    }
                                }
                            }

                            if (shbox.ok())
                            {
                                crse_boxes.push_back(shbox);
                            }
                        }
                    }
                }
            }

            Vector< Vector<FillBoxId> >& FBIDs     = TheFBIDs[l];
            Vector<Box>&                CrseBoxes = TheCrseBoxes[l];

            FBIDs.resize(crse_boxes.size());
            CrseBoxes.resize(crse_boxes.size());
            //
            // Now attempt to get as much coarse data as possible.
            //
            for (int i = 0, M = CrseBoxes.size(); i < M; i++)
            {
                BL_ASSERT(tempUnfillable.isEmpty());

                CrseBoxes[i] = crse_boxes[i];

                BL_ASSERT(CrseBoxes[i].intersects(thePDomain));

                theState.InterpAddBox(m_mfcd,
                                      m_mfid[l],
                                      &tempUnfillable,
                                      FBIDs[i],
                                      CrseBoxes[i],
                                      m_time,
                                      m_scomp,
                                      0,
                                      m_ncomp,
                                      extrap);

                unfillableThisLevel.catenate(tempUnfillable);
            }

            unfillableThisLevel.intersect(thePDomain);

            if (unfillableThisLevel.isEmpty())
            {
                Done = true;
            }
            else
            {
                unfilledThisLevel.clear();

                unfilledThisLevel.insert(unfilledThisLevel.end(),
                                         unfillableThisLevel.begin(),
                                         unfillableThisLevel.end());
            }
        }
    }

    m_mfcd.CollectData();
}